

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmListFileContext * __thiscall
cmMakefile::GetExecutionContext(cmListFileContext *__return_storage_ptr__,cmMakefile *this)

{
  cmListFileContext::cmListFileContext
            (__return_storage_ptr__,
             (this->CallStack).
             super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].Context);
  return __return_storage_ptr__;
}

Assistant:

cmListFileContext cmMakefile::GetExecutionContext() const
{
  return *this->CallStack.back().Context;
}